

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O3

void __thiscall FPTest_GetCachedPower_Test::TestBody(FPTest_GetCachedPower_Test *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  double dVar5;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  int local_64;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  undefined8 local_48;
  int local_40 [2];
  double local_38;
  
  local_64 = -0x3fd;
  do {
    dVar5 = ceil((double)(local_64 + 0x3f) * 0.30102999566398114);
    uVar1 = (int)dVar5 + 0x15b;
    uVar2 = (int)dVar5 + 0x162;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    local_48 = *(undefined8 *)
                (fmt::v5::internal::basic_data<void>::POW10_SIGNIFICANDS +
                (long)((int)uVar2 >> 3) * 8 + 8);
    local_40[0] = (int)*(short *)(fmt::v5::internal::basic_data<void>::POW10_EXPONENTS +
                                 (long)((int)uVar2 >> 3) * 2 + 2);
    testing::internal::CmpHelperLE<int,int>(local_60,"exp","fp.e",&local_64,local_40);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar4 = "";
      if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,0x62,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((double)local_64 + 26.575424759098897);
    testing::internal::CmpHelperLE<int,double>
              (local_60,"fp.e","exp + dec_exp_step * log2(10)",local_40,(double *)&local_70);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar4 = "";
      if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,100,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38 = pow(10.0,(double)(int)((uVar2 & 0xfffffff8) - 0x154));
    dVar5 = ldexp(((double)CONCAT44(0x45300000,(int)((ulong)local_48 >> 0x20)) -
                  1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0),local_40[0]);
    testing::internal::CmpHelperFloatingPointEQ<double>
              (local_60,"pow(10, dec_exp)","ldexp(fp.f, fp.e)",local_38,dVar5);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar4 = "";
      if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
                 ,0x65,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_64 < 0x400;
    local_64 = local_64 + 1;
  } while (bVar3);
  return;
}

Assistant:

TEST(FPTest, GetCachedPower) {
  typedef std::numeric_limits<double> limits;
  for (auto exp = limits::min_exponent; exp <= limits::max_exponent; ++exp) {
    int dec_exp = 0;
    auto fp = fmt::internal::get_cached_power(exp, dec_exp);
    EXPECT_LE(exp, fp.e);
    int dec_exp_step = 8;
    EXPECT_LE(fp.e, exp + dec_exp_step * log2(10));
    EXPECT_DOUBLE_EQ(pow(10, dec_exp), ldexp(fp.f, fp.e));
  }
}